

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SinglyLinkedList.h
# Opt level: O0

void __thiscall
SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
clear(SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this)

{
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pnVar1;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *temp;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pointer;
  SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (this->count != 0) {
    if (this->count == 1) {
      pnVar1 = this->head;
      if (pnVar1 != (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
        node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~node(pnVar1);
        operator_delete(pnVar1,0x28);
      }
      this->head = (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x0;
    }
    else {
      pnVar1 = this->head;
      while (temp = pnVar1,
            temp != (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
        pnVar1 = node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::getNext(temp);
        if (temp != (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
          node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          ~node(temp);
          operator_delete(temp,0x28);
        }
      }
    }
  }
  return;
}

Assistant:

void SinglyLinkedList<T>::clear()
{

  if(count == 0)
  {
    return;
  }

  else if(count == 1)
  {
    delete head;
    head = NULL;
  }

  else
  {
    node<T>* pointer = head;
    node<T>* temp;

    while (pointer != NULL)
    {
      temp = pointer -> getNext();
      delete pointer;
      pointer = temp;
    }

  }
}